

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseSubExpression
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options,int precedence)

{
  bool bVar1;
  SyntaxKind kind;
  TimingControlSyntax *timing;
  ExpressionSyntax *pEVar2;
  TimingControlExpressionSyntax *lhs;
  TaggedUnionExpressionSyntax *pTVar3;
  PrefixUnaryExpressionSyntax *left;
  SyntaxNode *this_00;
  ScopedNameSyntax *pSVar4;
  SyntaxNode *this_01;
  NameSyntax *newKeyword;
  TokenKind kind_00;
  Token TVar5;
  Token member;
  Token TVar6;
  AttrList AVar7;
  DepthGuard dg;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  DepthGuard::DepthGuard(&dg,this);
  TVar5 = ParserBase::peek(&this->super_ParserBase);
  kind_00 = TVar5.kind;
  bVar1 = slang::syntax::SyntaxFacts::isPossibleDelayOrEventControl(kind_00);
  if (bVar1) {
    timing = parseTimingControl(this);
    if (timing == (TimingControlSyntax *)0x0) {
      assert::assertFailed
                ("timingControl",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Parser_expressions.cpp"
                 ,0x38,
                 "ExpressionSyntax &slang::parsing::Parser::parseSubExpression(bitmask<ExpressionOptions>, int)"
                );
    }
    pEVar2 = parseExpression(this);
    lhs = slang::syntax::SyntaxFactory::timingControlExpression(&this->factory,timing,pEVar2);
    pTVar3 = (TaggedUnionExpressionSyntax *)
             parsePostfixExpression(this,&lhs->super_ExpressionSyntax,options);
  }
  else if (kind_00 == TaggedKeyword) {
    TVar5 = ParserBase::consume(&this->super_ParserBase);
    member = ParserBase::expect(&this->super_ParserBase,Identifier);
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar6.kind);
    if (bVar1) {
      pEVar2 = parseExpression(this);
    }
    else {
      pEVar2 = (ExpressionSyntax *)0x0;
    }
    pTVar3 = slang::syntax::SyntaxFactory::taggedUnionExpression(&this->factory,TVar5,member,pEVar2)
    ;
  }
  else {
    kind = slang::syntax::SyntaxFacts::getUnaryPrefixExpression(kind_00);
    if (kind == Unknown) {
      this_00 = &parsePrimaryExpression(this,options)->super_SyntaxNode;
      this_01 = this_00;
      while (this_01->kind == ScopedName) {
        pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(this_01);
        this_01 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&pSVar4->right);
      }
      if (this_01->kind == ConstructorName) {
        newKeyword = slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(this_00);
        pTVar3 = (TaggedUnionExpressionSyntax *)parseNewExpression(this,newKeyword,options);
        goto LAB_002ab764;
      }
      left = (PrefixUnaryExpressionSyntax *)
             parsePostfixExpression(this,(ExpressionSyntax *)this_00,options);
    }
    else {
      TVar5 = ParserBase::consume(&this->super_ParserBase);
      AVar7 = parseAttributes(this);
      pEVar2 = parsePrimaryExpression(this,options);
      pEVar2 = parsePostfixExpression(this,pEVar2,options);
      local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004703a8;
      local_60.super_SyntaxListBase.childCount = AVar7.size_;
      local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> = AVar7;
      left = slang::syntax::SyntaxFactory::prefixUnaryExpression
                       (&this->factory,kind,TVar5,&local_60,pEVar2);
    }
    pTVar3 = (TaggedUnionExpressionSyntax *)
             parseBinaryExpression
                       (this,&left->super_ExpressionSyntax,
                        (bitmask<slang::parsing::detail::ExpressionOptions>)(options.m_bits & 0xf7),
                        precedence);
  }
LAB_002ab764:
  (dg.parser)->recursionDepth = (dg.parser)->recursionDepth - 1;
  return &pTVar3->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseSubExpression(bitmask<ExpressionOptions> options, int precedence) {
    auto dg = setDepthGuard();

    auto current = peek();
    if (isPossibleDelayOrEventControl(current.kind)) {
        auto timingControl = parseTimingControl();
        ASSERT(timingControl);

        auto& expr = factory.timingControlExpression(*timingControl, parseExpression());
        return parsePostfixExpression(expr, options);
    }
    else if (current.kind == TokenKind::TaggedKeyword) {
        auto tagged = consume();
        auto member = expect(TokenKind::Identifier);

        ExpressionSyntax* expr = nullptr;
        if (isPossibleExpression(peek().kind))
            expr = &parseExpression();

        return factory.taggedUnionExpression(tagged, member, expr);
    }

    ExpressionSyntax* leftOperand;
    SyntaxKind opKind = getUnaryPrefixExpression(current.kind);
    if (opKind != SyntaxKind::Unknown) {
        auto opToken = consume();
        auto attributes = parseAttributes();

        auto& operand = parsePrimaryExpression(options);
        auto& postfix = parsePostfixExpression(operand, options);
        leftOperand = &factory.prefixUnaryExpression(opKind, opToken, attributes, postfix);
    }
    else {
        leftOperand = &parsePrimaryExpression(options);

        // If the primary is a new or scoped new operator we should handle
        // that separately (it doesn't participate in postfix expression parsing).
        if (isNewExpr(leftOperand))
            return parseNewExpression(leftOperand->as<NameSyntax>(), options);

        leftOperand = &parsePostfixExpression(*leftOperand, options);
    }

    options &= ~ExpressionOptions::AllowSuperNewCall;
    return parseBinaryExpression(leftOperand, options, precedence);
}